

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

void __thiscall
SCCLiveness::ProcessStackSymUse(SCCLiveness *this,StackSym *stackSym,Instr *instr,int usageSize)

{
  code *pcVar1;
  Lifetime *this_00;
  bool bVar2;
  uint newUseValue;
  JITTimeFunctionBody *this_01;
  char16 *pcVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  Lifetime *lifetime;
  int usageSize_local;
  Instr *instr_local;
  StackSym *stackSym_local;
  SCCLiveness *this_local;
  
  unique0x00012000 = *(Lifetime **)&(stackSym->scratch).globOpt;
  if (unique0x00012000 == (Lifetime *)0x0) {
    this_01 = Func::GetJITFunctionBody(this->func);
    pcVar3 = JITTimeFunctionBody::GetDisplayName(this_01);
    pcVar4 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_88);
    Output::Print(L"Function: %s (%s)       ",pcVar3,pcVar4);
    Output::Print(L"Reg: ");
    Sym::Dump(&stackSym->super_Sym,ValueType::Uninitialized);
    Output::Print(L"\n");
    Output::Flush();
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x23a,"((0))","Uninitialized reg?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  else {
    if (unique0x00012000->region != this->curRegion) {
      bVar2 = Func::DoOptimizeTry(this->func);
      if (!bVar2) {
        *(ushort *)&stack0xffffffffffffffd0->field_0x9c =
             *(ushort *)&stack0xffffffffffffffd0->field_0x9c & 0xfeff | 0x100;
      }
    }
    ExtendLifetime(this,stack0xffffffffffffffd0,instr);
  }
  this_00 = stack0xffffffffffffffd0;
  newUseValue = LinearScan::GetUseSpillCost
                          ((uint)this->loopNest,(uint)(this->lastOpHelperLabel != (LabelInstr *)0x0)
                          );
  Lifetime::AddToUseCount(this_00,newUseValue,this->curLoop,this->func);
  if (stack0xffffffffffffffd0->start < this->lastCall) {
    *(ushort *)&stack0xffffffffffffffd0->field_0x9c =
         *(ushort *)&stack0xffffffffffffffd0->field_0x9c & 0xfffd | 2;
  }
  if (stack0xffffffffffffffd0->start < this->lastNonOpHelperCall) {
    *(ushort *)&stack0xffffffffffffffd0->field_0x9c =
         *(ushort *)&stack0xffffffffffffffd0->field_0x9c & 0xfffb | 4;
  }
  *(ushort *)&stack0xffffffffffffffd0->field_0x9c =
       *(ushort *)&stack0xffffffffffffffd0->field_0x9c & 0xfff7;
  BVUnitT<unsigned_long>::Set(&stack0xffffffffffffffd0->intUsageBv,usageSize);
  return;
}

Assistant:

void
SCCLiveness::ProcessStackSymUse(StackSym * stackSym, IR::Instr * instr, int usageSize)
{
    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Function: %s (%s)       "), this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer));
        Output::Print(_u("Reg: "));
        stackSym->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
#endif
        AnalysisAssertMsg(UNREACHED, "Uninitialized reg?");
    }
    else
    {
        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }

        ExtendLifetime(lifetime, instr);
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    if (lifetime->start < this->lastCall)
    {
        lifetime->isLiveAcrossCalls = true;
    }
    if (lifetime->start < this->lastNonOpHelperCall)
    {
        lifetime->isLiveAcrossUserCalls = true;
    }
    lifetime->isDeadStore = false;

    lifetime->intUsageBv.Set(usageSize);
}